

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O1

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
AddrManImpl::GetAddr_
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,AddrManImpl *this,
          size_t max_addresses,size_t max_pct,optional<Network> network,bool filtered)

{
  ulong *__k;
  bool bVar1;
  uint uVar2;
  Network NVar3;
  ulong uVar4;
  time_point tVar5;
  uint64_t uVar6;
  __node_base_ptr p_Var7;
  Logger *this_00;
  ulong uVar8;
  long lVar9;
  _Hash_node_base *p_Var10;
  AddrInfo *this_01;
  ulong uVar11;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  _Storage<Network,_true> local_60;
  unsigned_long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (max_pct != 0) {
    uVar4 = (uVar4 * max_pct) / 100;
  }
  uVar8 = max_addresses;
  if (uVar4 < max_addresses) {
    uVar8 = uVar4;
  }
  if (max_addresses == 0) {
    uVar8 = uVar4;
  }
  tVar5 = NodeClock::now();
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    uVar4 = lVar9 >> 3;
    uVar11 = 0;
    do {
      if (uVar8 <= (ulong)(((long)(__return_storage_ptr__->
                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)(__return_storage_ptr__->
                                  super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                  super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))
      break;
      uVar4 = uVar4 + ~uVar11;
      if (uVar4 == 0) {
        uVar2 = 0x40;
      }
      else {
        lVar9 = 0x3f;
        if (uVar4 != 0) {
          for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        uVar2 = (uint)lVar9 ^ 0x3f;
      }
      do {
        uVar6 = RandomMixin<FastRandomContext>::randbits
                          (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,0x40 - uVar2)
        ;
      } while (uVar4 < uVar6);
      uVar2 = (uint)uVar11;
      SwapRandom(this,uVar2,(int)uVar6 + uVar2);
      __k = (ulong *)((this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar11);
      uVar4 = *__k;
      p_Var7 = std::
               _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         (&(this->mapInfo)._M_h,uVar4 % (this->mapInfo)._M_h._M_bucket_count,
                          (key_type_conflict *)__k,uVar4);
      if (p_Var7 == (__node_base_ptr)0x0) {
        p_Var10 = (_Hash_node_base *)0x0;
      }
      else {
        p_Var10 = p_Var7->_M_nxt;
      }
      if (p_Var10 == (_Hash_node_base *)0x0) {
        __assert_fail("it != mapInfo.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                      ,0x342,
                      "std::vector<CAddress> AddrManImpl::GetAddr_(size_t, size_t, std::optional<Network>, const bool) const"
                     );
      }
      this_01 = (AddrInfo *)(p_Var10 + 2);
      if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                  super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
LAB_00443048:
        bVar1 = AddrInfo::IsTerrible(this_01,(NodeSeconds)((long)tVar5.__d.__r / 1000000000));
        if (!filtered || !bVar1) {
          std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                    (__return_storage_ptr__,(value_type *)this_01);
        }
      }
      else {
        NVar3 = CNetAddr::GetNetClass((CNetAddr *)this_01);
        local_60._M_value =
             network.super__Optional_base<Network,_true,_true>._M_payload.
             super__Optional_payload_base<Network>._M_payload;
        if (NVar3 == local_60._M_value) goto LAB_00443048;
      }
      uVar11 = (ulong)(uVar2 + 1);
      uVar4 = (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->vRandom).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
    } while (uVar11 < uVar4);
  }
  this_00 = LogInstance();
  bVar1 = BCLog::Logger::WillLogCategoryLevel(this_00,ADDRMAN,Debug);
  if (bVar1) {
    local_40 = ((long)(__return_storage_ptr__->
                      super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(__return_storage_ptr__->
                      super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    logging_function._M_str = "GetAddr_";
    logging_function._M_len = 8;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
    ;
    source_file._M_len = 0x5b;
    LogPrintFormatInternal<unsigned_long>
              (logging_function,source_file,0x34e,ADDRMAN,Debug,(ConstevalFormatString<1U>)0x828f54,
               &local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CAddress> AddrManImpl::GetAddr_(size_t max_addresses, size_t max_pct, std::optional<Network> network, const bool filtered) const
{
    AssertLockHeld(cs);

    size_t nNodes = vRandom.size();
    if (max_pct != 0) {
        nNodes = max_pct * nNodes / 100;
    }
    if (max_addresses != 0) {
        nNodes = std::min(nNodes, max_addresses);
    }

    // gather a list of random nodes, skipping those of low quality
    const auto now{Now<NodeSeconds>()};
    std::vector<CAddress> addresses;
    for (unsigned int n = 0; n < vRandom.size(); n++) {
        if (addresses.size() >= nNodes)
            break;

        int nRndPos = insecure_rand.randrange(vRandom.size() - n) + n;
        SwapRandom(n, nRndPos);
        const auto it{mapInfo.find(vRandom[n])};
        assert(it != mapInfo.end());

        const AddrInfo& ai{it->second};

        // Filter by network (optional)
        if (network != std::nullopt && ai.GetNetClass() != network) continue;

        // Filter for quality
        if (ai.IsTerrible(now) && filtered) continue;

        addresses.push_back(ai);
    }
    LogDebug(BCLog::ADDRMAN, "GetAddr returned %d random addresses\n", addresses.size());
    return addresses;
}